

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O1

NodeSequence __thiscall
GraphBuilder::insertPthreadMutexUnlock(GraphBuilder *this,CallInst *callInstruction)

{
  long lVar1;
  long lVar2;
  UnlockNode *this_00;
  CallInst *callInst;
  NodeSequence NVar3;
  
  lVar1 = *(long *)(callInstruction + -0x20);
  lVar2 = 0;
  if ((lVar1 != 0) && (*(char *)(lVar1 + 0x10) == '\0')) {
    lVar2 = lVar1;
  }
  if ((lVar2 == 0) || (*(long *)(lVar2 + 0x18) != *(long *)(callInstruction + 0x48))) {
    this_00 = (UnlockNode *)operator_new(0x80);
    callInst = callInstruction;
    callInstruction = (CallInst *)(Instruction *)0x0;
  }
  else {
    this_00 = (UnlockNode *)operator_new(0x80);
    callInst = (CallInst *)0x0;
  }
  UnlockNode::UnlockNode(this_00,(Instruction *)callInstruction,callInst);
  NVar3.first = &addNode<UnlockNode>(this,this_00)->super_Node;
  NVar3.second = NVar3.first;
  return NVar3;
}

Assistant:

GraphBuilder::NodeSequence
GraphBuilder::insertPthreadMutexUnlock(const CallInst *callInstruction) {
    UnlockNode *unlockNode;
    if (callInstruction->getCalledFunction()) {
        unlockNode = addNode(createNode<NodeType::UNLOCK>(callInstruction));
    } else {
        unlockNode =
                addNode(createNode<NodeType::UNLOCK>(nullptr, callInstruction));
    }

    return {unlockNode, unlockNode};
}